

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int sync_tcp_connect(sync_device *d,char *host,unsigned_short port)

{
  int iVar1;
  int local_28;
  int i;
  unsigned_short port_local;
  char *host_local;
  sync_device *d_local;
  
  if (d->sock != -1) {
    close(d->sock);
  }
  iVar1 = server_connect(host,port);
  d->sock = iVar1;
  if (d->sock == -1) {
    d_local._4_4_ = -1;
  }
  else {
    for (local_28 = 0; local_28 < (int)d->num_tracks; local_28 = local_28 + 1) {
      free(d->tracks[local_28]->keys);
      d->tracks[local_28]->keys = (track_key *)0x0;
      d->tracks[local_28]->num_keys = 0;
    }
    for (local_28 = 0; local_28 < (int)d->num_tracks; local_28 = local_28 + 1) {
      iVar1 = fetch_track_data(d,d->tracks[local_28]);
      if (iVar1 != 0) {
        close(d->sock);
        d->sock = -1;
        return -1;
      }
    }
    d_local._4_4_ = 0;
  }
  return d_local._4_4_;
}

Assistant:

int sync_tcp_connect(struct sync_device *d, const char *host, unsigned short port)
{
	int i;
	if (d->sock != INVALID_SOCKET)
		closesocket(d->sock);

	d->sock = server_connect(host, port);
	if (d->sock == INVALID_SOCKET)
		return -1;

	for (i = 0; i < (int)d->num_tracks; ++i) {
		free(d->tracks[i]->keys);
		d->tracks[i]->keys = NULL;
		d->tracks[i]->num_keys = 0;
	}

	for (i = 0; i < (int)d->num_tracks; ++i) {
		if (fetch_track_data(d, d->tracks[i])) {
			closesocket(d->sock);
			d->sock = INVALID_SOCKET;
			return -1;
		}
	}
	return 0;
}